

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

float * get_half_cos_window(int block_size)

{
  int in_EDI;
  double dVar1;
  double dVar2;
  double cos_xd;
  int x;
  double cos_yd;
  int y;
  float *window_function;
  int local_2c;
  int local_1c;
  float *local_8;
  
  local_8 = (float *)aom_malloc(0x3bb3fd);
  if (local_8 == (float *)0x0) {
    local_8 = (float *)0x0;
  }
  else {
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      dVar1 = cos((((double)local_1c + 0.5) * 3.141592653589793) / (double)in_EDI -
                  1.5707963267948966);
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        dVar2 = cos((((double)local_2c + 0.5) * 3.141592653589793) / (double)in_EDI -
                    1.5707963267948966);
        local_8[local_1c * in_EDI + local_2c] = (float)(dVar1 * dVar2);
      }
    }
  }
  return local_8;
}

Assistant:

static float *get_half_cos_window(int block_size) {
  float *window_function =
      (float *)aom_malloc(block_size * block_size * sizeof(*window_function));
  if (!window_function) return NULL;
  for (int y = 0; y < block_size; ++y) {
    const double cos_yd = cos((.5 + y) * PI / block_size - PI / 2);
    for (int x = 0; x < block_size; ++x) {
      const double cos_xd = cos((.5 + x) * PI / block_size - PI / 2);
      window_function[y * block_size + x] = (float)(cos_yd * cos_xd);
    }
  }
  return window_function;
}